

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O1

uint32_t __thiscall spirv_cross::CFG::find_loop_dominator(CFG *this,uint32_t block_id)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  __node_base_ptr p_Var5;
  SPIRBlock *pSVar6;
  ulong uVar7;
  _Hash_node_base *p_Var8;
  uint uVar9;
  ulong uVar10;
  __node_base_ptr p_Var11;
  uint in_R10D;
  bool bVar12;
  long lVar13;
  bool bVar14;
  uint local_40;
  
  uVar10 = (ulong)block_id;
  do {
    uVar9 = (uint)uVar10;
    if (uVar9 == 0xffffffff) {
      return 0xffffffff;
    }
    uVar1 = (this->preceding_edges)._M_h._M_bucket_count;
    uVar7 = uVar10 % uVar1;
    p_Var2 = (this->preceding_edges)._M_h._M_buckets[uVar7];
    p_Var5 = (__node_base_ptr)0x0;
    if ((p_Var2 != (__node_base_ptr)0x0) &&
       (p_Var5 = p_Var2, p_Var11 = p_Var2->_M_nxt, uVar9 != *(uint *)&p_Var2->_M_nxt[1]._M_nxt)) {
      while (p_Var8 = p_Var11->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
        p_Var5 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var8[1]._M_nxt % uVar1 != uVar7) ||
           (p_Var5 = p_Var11, p_Var11 = p_Var8, uVar9 == *(uint *)&p_Var8[1]._M_nxt))
        goto LAB_002a9438;
      }
      p_Var5 = (__node_base_ptr)0x0;
    }
LAB_002a9438:
    if (p_Var5 == (__node_base_ptr)0x0) {
      p_Var8 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var8 = p_Var5->_M_nxt;
    }
    if ((p_Var8 == (_Hash_node_base *)0x0) ||
       (p_Var3 = p_Var8[3]._M_nxt, p_Var3 == (_Hash_node_base *)0x0)) {
      bVar14 = false;
      in_R10D = 0xffffffff;
    }
    else {
      p_Var4 = p_Var8[2]._M_nxt;
      local_40 = 0xffffffff;
      bVar12 = false;
      lVar13 = 0;
      do {
        pSVar6 = Variant::get<spirv_cross::SPIRBlock>
                           ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)((long)&p_Var4->_M_nxt + lVar13));
        if (pSVar6->merge == MergeSelection) {
          bVar14 = bVar12;
          if ((pSVar6->next_block).id != uVar9) goto LAB_002a94d9;
LAB_002a94c9:
          bVar12 = bVar14;
          local_40 = *(uint *)((long)&p_Var4->_M_nxt + lVar13);
          bVar14 = true;
        }
        else if (pSVar6->merge == MergeLoop) {
          bVar14 = true;
          if ((pSVar6->merge_block).id == uVar9) goto LAB_002a94c9;
          bVar14 = false;
        }
        else {
LAB_002a94d9:
          bVar14 = false;
        }
      } while ((!bVar14) && (bVar14 = (long)p_Var3 * 4 + -4 != lVar13, lVar13 = lVar13 + 4, bVar14))
      ;
      if (local_40 == 0xffffffff) {
        local_40 = *(uint *)&(p_Var8[2]._M_nxt)->_M_nxt;
      }
      uVar10 = (ulong)local_40;
      bVar14 = true;
      if ((!bVar12) && (local_40 != 0)) {
        pSVar6 = Variant::get<spirv_cross::SPIRBlock>
                           ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                            uVar10);
        bVar14 = pSVar6->merge != MergeLoop;
        if (!bVar14) {
          in_R10D = local_40;
        }
      }
    }
    if (!bVar14) {
      return in_R10D;
    }
  } while( true );
}

Assistant:

uint32_t CFG::find_loop_dominator(uint32_t block_id) const
{
	while (block_id != SPIRBlock::NoDominator)
	{
		auto itr = preceding_edges.find(block_id);
		if (itr == end(preceding_edges))
			return SPIRBlock::NoDominator;
		if (itr->second.empty())
			return SPIRBlock::NoDominator;

		uint32_t pred_block_id = SPIRBlock::NoDominator;
		bool ignore_loop_header = false;

		// If we are a merge block, go directly to the header block.
		// Only consider a loop dominator if we are branching from inside a block to a loop header.
		// NOTE: In the CFG we forced an edge from header to merge block always to support variable scopes properly.
		for (auto &pred : itr->second)
		{
			auto &pred_block = compiler.get<SPIRBlock>(pred);
			if (pred_block.merge == SPIRBlock::MergeLoop && pred_block.merge_block == ID(block_id))
			{
				pred_block_id = pred;
				ignore_loop_header = true;
				break;
			}
			else if (pred_block.merge == SPIRBlock::MergeSelection && pred_block.next_block == ID(block_id))
			{
				pred_block_id = pred;
				break;
			}
		}

		// No merge block means we can just pick any edge. Loop headers dominate the inner loop, so any path we
		// take will lead there.
		if (pred_block_id == SPIRBlock::NoDominator)
			pred_block_id = itr->second.front();

		block_id = pred_block_id;

		if (!ignore_loop_header && block_id)
		{
			auto &block = compiler.get<SPIRBlock>(block_id);
			if (block.merge == SPIRBlock::MergeLoop)
				return block_id;
		}
	}

	return block_id;
}